

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void NavierStokesBase::Initialize(void)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  ParmParse pp2;
  int do_scalar_update_in_order;
  ParmParse pp;
  char *in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe72;
  undefined1 in_stack_fffffffffffffe73;
  undefined1 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe75;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  string *in_stack_fffffffffffffe78;
  string *prefix;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 local_161 [61];
  int in_stack_fffffffffffffedc;
  double *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  ParmParse *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  ParmParse *in_stack_ffffffffffffff00;
  allocator local_d1;
  string local_d0 [80];
  char *in_stack_ffffffffffffff80;
  ParmParse *in_stack_ffffffffffffff88;
  
  if (((anonymous_namespace)::initialized & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"ns",&local_d1);
    amrex::ParmParse::ParmParse
              ((ParmParse *)
               CONCAT17(in_stack_fffffffffffffe87,
                        CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),
               in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(bool *)in_stack_fffffffffffffef0
               ,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::get
              (in_stack_fffffffffffffef0,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(bool *)in_stack_fffffffffffffef0
               ,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    bVar1 = amrex::ParmParse::contains(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if ((((bVar1) ||
         (bVar1 = amrex::ParmParse::contains(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80),
         bVar1)) ||
        (bVar1 = amrex::ParmParse::contains(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80),
        bVar1)) ||
       ((bVar1 = amrex::ParmParse::contains(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80),
        bVar1 || (bVar1 = amrex::ParmParse::contains
                                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80), bVar1))))
    {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (string *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    if (1.0 < init_shrink) {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    if ((1.0 < be_cn_theta) || (be_cn_theta < 0.5)) {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    if ((do_derefine_outflow == 1) && (do_refine_outflow == 1)) {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    bVar1 = amrex::ParmParse::contains(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    if (bVar1) {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (string *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,
                                              CONCAT15(in_stack_fffffffffffffe75,
                                                       CONCAT14(in_stack_fffffffffffffe74,
                                                                CONCAT13(in_stack_fffffffffffffe73,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffe72,
                                                  in_stack_fffffffffffffe70)))))),
                            in_stack_fffffffffffffe68);
    if ((((bVar1) &&
         (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffe77,
                                              CONCAT16(in_stack_fffffffffffffe76,
                                                       CONCAT15(in_stack_fffffffffffffe75,
                                                                CONCAT14(in_stack_fffffffffffffe74,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffe73,
                                                  CONCAT12(in_stack_fffffffffffffe72,
                                                           in_stack_fffffffffffffe70)))))),
                                  in_stack_fffffffffffffe68), bVar1)) &&
        (in_stack_fffffffffffffe87 =
              std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffe77,
                                       CONCAT16(in_stack_fffffffffffffe76,
                                                CONCAT15(in_stack_fffffffffffffe75,
                                                         CONCAT14(in_stack_fffffffffffffe74,
                                                                  CONCAT13(in_stack_fffffffffffffe73
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffe72,
                                                  in_stack_fffffffffffffe70)))))),
                              in_stack_fffffffffffffe68), (bool)in_stack_fffffffffffffe87)) &&
       (in_stack_fffffffffffffe86 =
             std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffe77,
                                      CONCAT16(in_stack_fffffffffffffe76,
                                               CONCAT15(in_stack_fffffffffffffe75,
                                                        CONCAT14(in_stack_fffffffffffffe74,
                                                                 CONCAT13(in_stack_fffffffffffffe73,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffe72,
                                                  in_stack_fffffffffffffe70)))))),
                             in_stack_fffffffffffffe68), (bool)in_stack_fffffffffffffe86)) {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    prefix = (string *)local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_161 + 1),"godunov",(allocator *)prefix);
    amrex::ParmParse::ParmParse
              ((ParmParse *)
               CONCAT17(in_stack_fffffffffffffe87,
                        CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),prefix);
    std::__cxx11::string::~string((string *)(local_161 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_161);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(bool *)in_stack_fffffffffffffef0
               ,in_stack_fffffffffffffeec);
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe77,
                                     CONCAT16(in_stack_fffffffffffffe76,
                                              CONCAT15(in_stack_fffffffffffffe75,
                                                       CONCAT14(in_stack_fffffffffffffe74,
                                                                CONCAT13(in_stack_fffffffffffffe73,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffe72,
                                                  in_stack_fffffffffffffe70)))))),
                            in_stack_fffffffffffffe68);
    if (((bool)uVar2) ||
       (in_stack_fffffffffffffe76 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe76,
                                                     CONCAT15(in_stack_fffffffffffffe75,
                                                              CONCAT14(in_stack_fffffffffffffe74,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffe73,
                                                  CONCAT12(in_stack_fffffffffffffe72,
                                                           in_stack_fffffffffffffe70)))))),
                             in_stack_fffffffffffffe68), (bool)in_stack_fffffffffffffe76)) {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    if ((godunov_use_forces_in_trans & 1U) != 0) {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe76,
                                                    CONCAT15(in_stack_fffffffffffffe75,
                                                             CONCAT14(in_stack_fffffffffffffe74,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffe73,
                                                  CONCAT12(in_stack_fffffffffffffe72,
                                                           in_stack_fffffffffffffe70)))))),
                            in_stack_fffffffffffffe68);
    if ((bool)uVar3) {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    amrex::ParmParse::query
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (string *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    uVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe76,
                                                    CONCAT15(uVar3,CONCAT14(
                                                  in_stack_fffffffffffffe74,
                                                  CONCAT13(in_stack_fffffffffffffe73,
                                                           CONCAT12(in_stack_fffffffffffffe72,
                                                                    in_stack_fffffffffffffe70)))))),
                            in_stack_fffffffffffffe68);
    if ((((bool)uVar4) &&
        (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe76,
                                                            CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  in_stack_fffffffffffffe73,
                                                  CONCAT12(in_stack_fffffffffffffe72,
                                                           in_stack_fffffffffffffe70)))))),
                                 in_stack_fffffffffffffe68), bVar1)) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe76,
                                                         CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  bVar1,CONCAT12(in_stack_fffffffffffffe72,
                                                                 in_stack_fffffffffffffe70)))))),
                                in_stack_fffffffffffffe68), bVar1)) {
      amrex::Abort_host((char *)CONCAT17(in_stack_fffffffffffffe87,
                                         CONCAT16(in_stack_fffffffffffffe86,
                                                  in_stack_fffffffffffffe80)));
    }
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x7b4a51);
    (anonymous_namespace)::initialized = 1;
    amrex::ParmParse::~ParmParse((ParmParse *)0x7b4a64);
    amrex::ParmParse::~ParmParse((ParmParse *)0x7b4a71);
  }
  return;
}

Assistant:

void
NavierStokesBase::Initialize ()
{
    if (initialized) {
        return;
    }

    ParmParse pp("ns");

    pp.query("dump_plane",dump_plane);

    pp.query("benchmarking",benchmarking);

    pp.query("v",verbose);


    //
    // Get timestepping parameters.
    //
    pp.get("cfl",cfl);
    pp.query("init_iter",init_iter);
    pp.query("init_vel_iter",init_vel_iter);
    pp.query("init_shrink",init_shrink);
    pp.query("dt_cutoff",dt_cutoff);
    pp.query("change_max",change_max);
    pp.query("fixed_dt",fixed_dt);
    pp.query("init_dt", init_dt);
    pp.query("stop_when_steady",stop_when_steady);
    pp.query("steady_tol",steady_tol);
    pp.query("sum_interval",sum_interval);
    pp.query("gravity",gravity);
    //
    // Get run options.
    //
    pp.query("do_temp",                  do_temp          );
    pp.query("do_trac2",                 do_trac2         );
    pp.query("do_cons_trac",             do_cons_trac     );
    pp.query("do_cons_trac2",            do_cons_trac2    );
    pp.query("do_sync_proj",             do_sync_proj     );
    pp.query("do_reflux",                do_reflux        );
    pp.query("do_init_vort_proj",        do_init_vort_proj);
    pp.query("do_init_proj",             do_init_proj     );
    pp.query("do_mac_proj",              do_mac_proj      );
    pp.query("do_denminmax",             do_denminmax     );
    pp.query("do_scalminmax",            do_scalminmax    );

    if ( pp.contains("do_temp_ref") ||
         pp.contains("do_density_ref") ||
         pp.contains("do_tracer_ref") ||
         pp.contains("do_tracer2_ref") ||
         pp.contains("do_vorticity_ref") ) {
        amrex::Abort("ns.do_*_ref no longer supported. Refinement now implemented using refinement_indicators. For help, see UsersGuide or examples in /Exec");
    }

    pp.query("visc_tol",visc_tol);
    pp.query("visc_abs_tol",visc_abs_tol);

    pp.query("getForceVerbose",          getForceVerbose  );
    pp.query("do_LES",                   do_LES  );
    pp.query("getLESVerbose",            getLESVerbose  );
    pp.query("LES_model",                LES_model  );
    pp.query("smago_Cs_cst",             smago_Cs_cst  );
    pp.query("sigma_Cs_cst",             sigma_Cs_cst  );

    pp.query("avg_interval",             avg_interval  );
    pp.query("compute_fluctuations",     compute_fluctuations  );

#ifdef AMREX_USE_EB
    pp.query("refine_cutcells", refine_cutcells);
#endif

    int do_scalar_update_in_order = 0;
    pp.query("do_scalar_update_in_order",do_scalar_update_in_order );
    if (do_scalar_update_in_order) {
        amrex::Abort("NavierStokesBase::Initialize(): do_scalar_update_in_order no longer supported. If needed, please open issue on github.");
    }

    // Don't let init_shrink be greater than 1
    if (init_shrink > 1.0) {
        amrex::Abort("NavierStokesBase::Initialize(): init_shrink cannot be greater than 1");
    }

    pp.query("be_cn_theta",be_cn_theta);
    if (be_cn_theta > 1.0 || be_cn_theta < .5) {
        amrex::Abort("NavierStokesBase::Initialize(): Must have be_cn_theta <= 1.0 && >= .5");
    }
    //
    // Set parameters dealing with how grids are treated at outflow boundaries.
    //
    pp.query("do_refine_outflow",do_refine_outflow);
    pp.query("do_derefine_outflow",do_derefine_outflow);
    if (do_derefine_outflow == 1 && do_refine_outflow == 1) {
      amrex::Abort("NavierStokesBase::Initialize(): Cannot have both do_refine_outflow==1 and do_derefine_outflow==1");
    }

    pp.query("Nbuf_outflow",Nbuf_outflow);
    AMREX_ASSERT(Nbuf_outflow >= 0);
    AMREX_ASSERT(!(Nbuf_outflow <= 0 && do_derefine_outflow == 1));

    // If dx,dy,dz,Rcyl<0 (default) the volWgtSum is computed over the entire domain
    pp.query("volWgtSum_sub_origin_x",volWgtSum_sub_origin_x);
    pp.query("volWgtSum_sub_origin_y",volWgtSum_sub_origin_y);
    pp.query("volWgtSum_sub_origin_z",volWgtSum_sub_origin_z);
    pp.query("volWgtSum_sub_Rcyl",volWgtSum_sub_Rcyl);
    pp.query("volWgtSum_sub_dx",volWgtSum_sub_dx);
    pp.query("volWgtSum_sub_dy",volWgtSum_sub_dy);
    pp.query("volWgtSum_sub_dz",volWgtSum_sub_dz);

    // Are we going to do velocity or momentum update?
    pp.query("do_mom_diff",do_mom_diff);

#ifdef AMREX_PARTICLES
    read_particle_params ();
#endif

    //
    // Get checkpoint info
    //
    pp.query("gradp_in_checkpoint", gradp_in_checkpoint);
    pp.query("avg_in_checkpoint",   average_in_checkpoint);

    //
    // Get advection scheme options
    //
    if ( pp.contains("use_godunov") ) {
        Abort("ns.use_godunov is depreciated. Please use ns.advection_scheme instead. Options are MOL, Godunov_PLM (default), Godunov_PPM"); // Godunov_BDS");
    }

    pp.query("advection_scheme", advection_scheme);
    if ( advection_scheme != "MOL" && advection_scheme != "Godunov_PLM" && advection_scheme != "Godunov_PPM" && advection_scheme != "BDS") {
        Abort("Invalid advection_scheme. Options are MOL, Godunov_PLM, Godunov_PPM, BDS");
    }

    ParmParse pp2("godunov");
    pp2.query("use_forces_in_trans", godunov_use_forces_in_trans);

#ifdef AMREX_USE_EB
    //
    // EB Godunov restrictions
    //
    if ( advection_scheme == "Godunov_PPM" || advection_scheme == "BDS") {
        amrex::Abort("this advection_scheme is not implemented for EB. Options are MOL or Godunov_PLM (default)");
    }
    if ( godunov_use_forces_in_trans ) {
        amrex::Abort("use_forces_in_trans not implemented within EB Godunov. Set godunov.use_forces_in_trans=0.");
    }

    //
    // BDS restrictions
    //
    if (advection_scheme == "BDS"){
        amrex::Abort("BDS not implemented with Embedded Boundaries.");
    }

    //
    // Redistribution
    //
    pp.query("redistribution_type", redistribution_type);
    if (redistribution_type != "NoRedist" &&
        redistribution_type != "FluxRedist" &&
        redistribution_type != "StateRedist" ) {
        amrex::Abort("redistribution type must be NoRedist, FluxRedist, or StateRedist");
    }
#endif

    amrex::ExecOnFinalize(NavierStokesBase::Finalize);

    initialized = true;
}